

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

cf_errno_t cf_file_readdir(cf_file_dir_t *dir,cf_file_dirent_t *dirinfo)

{
  cf_char_t *pcVar1;
  dirent *pdVar2;
  __dirent_t *_dirent;
  __dir_t *_dir;
  cf_file_dirent_t *dirinfo_local;
  cf_file_dir_t *dir_local;
  
  if ((dir == (cf_file_dir_t *)0x0) || (dirinfo == (cf_file_dirent_t *)0x0)) {
    dir_local._4_4_ = 2;
  }
  else {
    pcVar1 = dirinfo->__real_impl;
    pdVar2 = readdir(*(DIR **)dir->__real_impl);
    *(dirent **)pcVar1 = pdVar2;
    if (*(long *)pcVar1 == 0) {
      dir_local._4_4_ = 0xc;
    }
    else {
      cf_strcpy_s(dirinfo->name,0x100,(cf_char_t *)(*(long *)pcVar1 + 0x13));
      dir_local._4_4_ = 0;
    }
  }
  return dir_local._4_4_;
}

Assistant:

cf_errno_t cf_file_readdir(cf_file_dir_t* dir, cf_file_dirent_t* dirinfo) {
    __dir_t* _dir;
    __dirent_t* _dirent;
    if(!dir || !dirinfo) return CF_EPARAM;
    _dir = (__dir_t*)dir->__real_impl;
    _dirent = (__dirent_t*)dirinfo->__real_impl;
#ifdef CF_OS_WIN
    if(!_dir->handle) return CF_ENULLPTR;
    if(_findnext(_dir->handle, &_dirent->fileinfo) == -1L) return CF_EEOF;
    cf_strcpy_s(dirinfo->name, sizeof(dirinfo->name), _dirent->fileinfo.name);
#else
    _dirent->pdir = readdir(_dir->dir);
    if(!_dirent->pdir) return CF_EEOF;
    cf_strcpy_s(dirinfo->name, sizeof(dirinfo->name), _dirent->pdir->d_name);
#endif
    return CF_OK;
}